

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# completion_handler.hpp
# Opt level: O2

void asio::detail::
     completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:852:27)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  atomic<int> *paVar1;
  UDPAddress *e2;
  ostringstream *poVar2;
  NATHolePuncher *pNVar3;
  ulong uVar4;
  NATHolePuncher *pNVar5;
  tonk *ptVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Connection *this;
  void *ptr;
  BufferAllocator *pBVar9;
  bool bVar10;
  OutputWorker *pOVar11;
  ulong value;
  uint64_t value_00;
  ushort uVar12;
  tonk *this_00;
  undefined1 local_2a8 [32];
  undefined1 local_288 [8];
  undefined1 local_280 [24];
  type handler;
  address local_200;
  ptr local_1e0;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  local_1e0.h = &handler;
  handler.this = (Connection *)base[1].next_;
  handler.receiveUsec = (uint64_t)base[1].func_;
  handler.addr.impl_.data_._0_8_ = *(undefined8 *)&base[1].task_result_;
  uVar7 = *(undefined8 *)((long)&base[2].next_ + 4);
  uVar8 = *(undefined8 *)((long)&base[2].func_ + 4);
  handler.addr.impl_.data_._8_4_ = SUB84(base[2].next_,0);
  handler.addr.impl_.data_._12_4_ = (undefined4)uVar7;
  handler.addr.impl_.data_._16_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  handler.addr.impl_.data_._20_4_ = (undefined4)uVar8;
  handler.addr.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar8 >> 0x20);
  handler.datagram.Data = (uint8_t *)base[3].next_;
  handler.datagram._8_8_ = base[3].func_;
  handler.datagram.FreePtr = *(void **)&base[3].task_result_;
  handler.datagram.AllocatorForFree = (BufferAllocator *)base[4].next_;
  handler.handshakeKey = (uint64_t)base[4].func_;
  handler.addrMap = *(ConnectionAddrMap **)&base[4].task_result_;
  handler.sender = (IUDPSender *)base[5].next_;
  local_1e0.v = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:852:27)>
                 *)base;
  local_1e0.p = (completion_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:852:27)>
                 *)base;
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:852:27)>
  ::ptr::reset(&local_1e0);
  this = handler.this;
  if (owner == (void *)0x0) goto LAB_001481b4;
  pNVar3 = ((handler.this)->HolePuncher)._M_t.
           super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>.
           _M_t.
           super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
           .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
  if (pNVar3 == (NATHolePuncher *)0x0) {
    if ((int)((handler.this)->Logger).ChannelMinLevel < 4) {
      local_1a8._0_8_ = ((handler.this)->Logger).ChannelName;
      poVar2 = (ostringstream *)(local_1a8 + 0x10);
      local_1a8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,(string *)&(this->Logger).Prefix);
      std::operator<<((ostream *)poVar2,"Ignoring P2P connect: P2P connection is not in progress");
      pOVar11 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar11,(LogStringBuffer *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
    }
  }
  else {
    uVar4 = (pNVar3->StartParams).EncryptionKey;
    value = uVar4 >> 0x20 | uVar4 << 0x20;
    if ((pNVar3->StartParams).WinTies != false) {
      value = uVar4;
    }
    if (handler.handshakeKey == value) {
      pNVar5 = ((handler.this)->HolePuncher)._M_t.
               super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
               ._M_t.
               super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
               .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
      e2 = &handler.addr;
      if ((((pNVar3->SeenProbe)._M_base._M_i & 1U) == 0) || ((pNVar5->StartParams).WinTies != true))
      {
        local_2a8._0_8_ = &((handler.this)->Outgoing).PrivateLock;
        LOCK();
        (pNVar5->SeenProbe)._M_base._M_i = true;
        UNLOCK();
        std::recursive_mutex::lock((recursive_mutex *)local_2a8._0_8_);
        local_1a8._0_8_ = *(undefined8 *)&(this->Outgoing).PeerUDPAddress.impl_.data_;
        uVar7 = *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 8);
        local_1a8._20_8_ =
             *(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0x14);
        local_1a8._16_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&(this->Outgoing).PeerUDPAddress.impl_.data_ + 0xc) >>
             0x20);
        local_1a8._8_4_ = (undefined4)uVar7;
        local_1a8._12_4_ = (undefined4)((ulong)uVar7 >> 0x20);
        tonk::Locker::~Locker((Locker *)local_2a8);
        bVar10 = asio::ip::operator!=((basic_endpoint<asio::ip::udp> *)local_1a8,e2);
        if ((bVar10) || (handler.addrMap != (this->Deps).AddressMap)) {
          if (handler.addr.impl_.data_.base.sa_family != 2) {
            local_280._0_8_ =
                 CONCAT44(handler.addr.impl_.data_._12_4_,handler.addr.impl_.data_._8_4_);
            local_280._8_8_ =
                 CONCAT44(handler.addr.impl_.data_._20_4_,handler.addr.impl_.data_._16_4_);
            local_280._16_8_ = ZEXT48(handler.addr.impl_.data_.v6.sin6_scope_id);
            local_288._4_4_ = 0;
          }
          else {
            local_280._16_8_ = (TonkConnectionConfig *)0x0;
            local_280._0_8_ = (Channel *)0x0;
            local_280._8_8_ = (TonkConnection)0x0;
            local_288._4_4_ = handler.addr.impl_.data_.v6.sin6_flowinfo;
          }
          local_288._0_4_ = ZEXT14(handler.addr.impl_.data_.base.sa_family != 2);
          asio::ip::address::to_string_abi_cxx11_((string *)local_2a8,(address *)local_288);
          if (DAT_001d8780 < 4) {
            uVar12 = swap_bytes(handler.addr.impl_.data_.v4.sin_port);
            poVar2 = (ostringstream *)(local_1a8 + 0x10);
            local_1a8._0_8_ = tonk::ModuleLogger;
            local_1a8._8_4_ = Warning;
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::operator<<((ostream *)poVar2,(string *)&DAT_001d87b0);
            std::operator<<((ostream *)poVar2,"Switching NAT port pairs for tie-breaker. New dest: "
                           );
            std::operator<<((ostream *)poVar2,(string *)local_2a8);
            std::operator<<((ostream *)poVar2,":");
            std::ostream::operator<<((ostream *)poVar2,uVar12);
            pOVar11 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar11,(LogStringBuffer *)local_1a8);
            std::__cxx11::ostringstream::~ostringstream(poVar2);
          }
          std::__cxx11::string::~string((string *)local_2a8);
          tonk::Connection::setPeerAddressAndSource(this,handler.addrMap,handler.sender,e2);
        }
        else if (DAT_001d8780 < 2) {
          poVar2 = (ostringstream *)(local_1a8 + 0x10);
          local_1a8._0_8_ = tonk::ModuleLogger;
          local_1a8._8_4_ = Debug;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,(string *)&DAT_001d87b0);
          std::operator<<((ostream *)poVar2,
                          "Repeated connection request from the same source address - No change needed"
                         );
          pOVar11 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar11,(LogStringBuffer *)local_1a8);
          goto LAB_00148129;
        }
      }
      else if (DAT_001d8780 < 4) {
        poVar2 = (ostringstream *)(local_1a8 + 0x10);
        local_1a8._0_8_ = tonk::ModuleLogger;
        local_1a8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,(string *)&DAT_001d87b0);
        std::operator<<((ostream *)poVar2,
                        "Ignoring connection request - We are tie breaker and received a probe already"
                       );
        pOVar11 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar11,(LogStringBuffer *)local_1a8);
LAB_00148129:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 0x10));
      }
      tonk::SessionIncoming::ProcessDatagram
                ((SessionIncoming *)local_2a8,(uint64_t)&this->Incoming,
                 (UDPAddress *)handler.receiveUsec,(uint8_t *)e2,(uint)handler.datagram.Data);
      if ((ErrorResult *)local_2a8._0_8_ != (ErrorResult *)0x0) {
        tonk::Connection::onDecodeFailure(this,(Result *)local_2a8);
      }
      pBVar9 = handler.datagram.AllocatorForFree;
      ptr = handler.datagram.FreePtr;
      if (handler.datagram.AllocatorForFree != (BufferAllocator *)0x0) {
        local_1a8._0_8_ = handler.datagram.AllocatorForFree;
        std::recursive_mutex::lock((recursive_mutex *)handler.datagram.AllocatorForFree);
        pktalloc::Allocator::Free(&pBVar9->Allocator,(uint8_t *)ptr);
        tonk::Locker::~Locker((Locker *)local_1a8);
      }
      tonk::Result::~Result((Result *)local_2a8);
    }
    else {
      tonk::HexString_abi_cxx11_((string *)local_2a8,(tonk *)handler.handshakeKey,value);
      pNVar3 = (this->HolePuncher)._M_t.
               super___uniq_ptr_impl<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>
               ._M_t.
               super__Tuple_impl<0UL,_tonk::NATHolePuncher_*,_std::default_delete<tonk::NATHolePuncher>_>
               .super__Head_base<0UL,_tonk::NATHolePuncher_*,_false>._M_head_impl;
      ptVar6 = (tonk *)(pNVar3->StartParams).EncryptionKey;
      this_00 = (tonk *)((ulong)ptVar6 >> 0x20 | (long)ptVar6 << 0x20);
      if ((pNVar3->StartParams).WinTies != false) {
        this_00 = ptVar6;
      }
      tonk::HexString_abi_cxx11_((string *)local_288,this_00,value_00);
      if (handler.addr.impl_.data_.base.sa_family != 2) {
        local_200.ipv6_address_.addr_.__in6_u._0_8_ =
             CONCAT44(handler.addr.impl_.data_._12_4_,handler.addr.impl_.data_._8_4_);
        local_200.ipv6_address_.addr_.__in6_u._8_8_ =
             CONCAT44(handler.addr.impl_.data_._20_4_,handler.addr.impl_.data_._16_4_);
        local_200.ipv6_address_.scope_id_ = (unsigned_long)handler.addr.impl_.data_.v6.sin6_scope_id
        ;
        local_200.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      }
      else {
        local_200.ipv6_address_.scope_id_ = 0;
        local_200.ipv6_address_.addr_.__in6_u._0_8_ = 0;
        local_200.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_200.ipv4_address_.addr_.s_addr =
             (in4_addr_type)(in4_addr_type)handler.addr.impl_.data_.v6.sin6_flowinfo;
      }
      local_200.type_ = (anon_enum_32)(handler.addr.impl_.data_.base.sa_family != 2);
      asio::ip::address::to_string_abi_cxx11_(&local_1c8,&local_200);
      if ((int)(this->Logger).ChannelMinLevel < 4) {
        local_1a8._0_8_ = (this->Logger).ChannelName;
        uVar12 = swap_bytes(handler.addr.impl_.data_.v4.sin_port);
        poVar2 = (ostringstream *)(local_1a8 + 0x10);
        local_1a8._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,(string *)&(this->Logger).Prefix);
        std::operator<<((ostream *)poVar2,"Ignoring P2P connect: HandshakeKey=");
        std::operator<<((ostream *)poVar2,(string *)local_2a8);
        std::operator<<((ostream *)poVar2," IncomingKey=");
        std::operator<<((ostream *)poVar2,(string *)local_288);
        std::operator<<((ostream *)poVar2," does not match from ");
        std::operator<<((ostream *)poVar2,(string *)&local_1c8);
        std::operator<<((ostream *)poVar2," : ");
        std::ostream::operator<<((ostream *)poVar2,uVar12);
        pOVar11 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar11,(LogStringBuffer *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
      }
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::string::~string((string *)local_2a8);
    }
  }
  LOCK();
  paVar1 = &(this->super_IConnection).SelfRefCount.RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
LAB_001481b4:
  completion_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:852:27)>
  ::ptr::~ptr(&local_1e0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    completion_handler* h(static_cast<completion_handler*>(base));
    ptr p = { asio::detail::addressof(h->handler_), h, h };
    handler_work<Handler> w(h->handler_);

    ASIO_HANDLER_COMPLETION((*h));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(h->handler_));
    p.h = asio::detail::addressof(handler);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      w.complete(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }